

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O0

uint32_t * __thiscall diligent_spirv_cross::Parser::stream(Parser *this,Instruction *instr)

{
  uint32_t uVar1;
  uint32_t uVar2;
  size_type sVar3;
  CompilerError *this_00;
  Instruction *instr_local;
  Parser *this_local;
  
  if (instr->length == 0) {
    this_local = (Parser *)0x0;
  }
  else {
    uVar1 = instr->offset;
    uVar2 = instr->length;
    sVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&(this->ir).spirv);
    if (sVar3 < uVar1 + uVar2) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Compiler::stream() out of range.");
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    this_local = (Parser *)
                 ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&(this->ir).spirv,(ulong)instr->offset);
  }
  return (uint32_t *)this_local;
}

Assistant:

const uint32_t *Parser::stream(const Instruction &instr) const
{
	// If we're not going to use any arguments, just return nullptr.
	// We want to avoid case where we return an out of range pointer
	// that trips debug assertions on some platforms.
	if (!instr.length)
		return nullptr;

	if (instr.offset + instr.length > ir.spirv.size())
		SPIRV_CROSS_THROW("Compiler::stream() out of range.");
	return &ir.spirv[instr.offset];
}